

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_proxy_define_own_property
              (JSContext *ctx,JSValue obj,JSAtom prop,JSValue val,JSValue getter,JSValue setter,
              int flags)

{
  JSObject *p_00;
  int iVar1;
  int iVar2;
  BOOL BVar3;
  JSRefCountHeader *p;
  JSProxyData *pJVar4;
  char *fmt;
  JSValueUnion JVar5;
  JSValue v;
  JSValue func_obj;
  JSValue JVar6;
  JSValue JVar7;
  JSValue JVar8;
  JSValue val_00;
  JSValue val_01;
  uint local_e0;
  uint local_d8;
  JSValueUnion local_d0;
  int64_t local_c8;
  JSValue method;
  JSPropertyDescriptor desc;
  JSValueUnion local_68;
  int64_t iStack_60;
  JSValueUnion local_58;
  int64_t local_50;
  JSValue local_48;
  
  JVar5 = val.u;
  pJVar4 = get_proxy_method(ctx,&method,obj,0x65);
  if (pJVar4 == (JSProxyData *)0x0) {
    return -1;
  }
  if ((int)method.tag == 3) {
    iVar1 = JS_DefineProperty(ctx,pJVar4->target,prop,val,getter,setter,flags);
    return iVar1;
  }
  JVar6 = JS_AtomToValue(ctx,prop);
  if ((int)JVar6.tag == 6) {
LAB_0013a566:
    v.tag = method.tag;
    v.u.float64 = method.u.float64;
    JS_FreeValue(ctx,v);
    return -1;
  }
  JVar7 = JS_NewObject(ctx);
  if ((int)JVar7.tag == 6) {
    JS_FreeValue(ctx,JVar6);
    goto LAB_0013a566;
  }
  if (((uint)flags >> 0xb & 1) != 0) {
    local_d8 = (uint)getter.tag;
    if (0xfffffff4 < local_d8) {
      *(int *)getter.u.ptr = *getter.u.ptr + 1;
    }
    JS_DefinePropertyValue(ctx,JVar7,0x41,getter,7);
  }
  if (((uint)flags >> 0xc & 1) != 0) {
    local_e0 = (uint)setter.tag;
    if (0xfffffff4 < local_e0) {
      *(int *)setter.u.ptr = *setter.u.ptr + 1;
    }
    JS_DefinePropertyValue(ctx,JVar7,0x42,setter,7);
  }
  if (((uint)flags >> 0xd & 1) != 0) {
    if (0xfffffff4 < (uint)val.tag) {
      *(int *)JVar5.ptr = *JVar5.ptr + 1;
    }
    JS_DefinePropertyValue(ctx,JVar7,0x40,val,7);
  }
  if (((uint)flags >> 9 & 1) != 0) {
    JVar8.u._0_4_ = (uint)flags >> 1 & 1;
    JVar8.u._4_4_ = 0;
    JVar8.tag = 1;
    JS_DefinePropertyValue(ctx,JVar7,0x3e,JVar8,7);
  }
  if (((uint)flags >> 10 & 1) != 0) {
    val_00.u._0_4_ = (uint)flags >> 2 & 1;
    val_00.u._4_4_ = 0;
    val_00.tag = 1;
    JS_DefinePropertyValue(ctx,JVar7,0x3f,val_00,7);
  }
  if (((uint)flags >> 8 & 1) != 0) {
    val_01.u._0_4_ = flags & 1;
    val_01.u._4_4_ = 0;
    val_01.tag = 1;
    JS_DefinePropertyValue(ctx,JVar7,0x3d,val_01,7);
  }
  local_68.ptr = *(void **)&(pJVar4->target).u;
  iStack_60 = (pJVar4->target).tag;
  local_d0 = JVar6.u;
  local_58 = local_d0;
  local_c8 = JVar6.tag;
  local_50 = local_c8;
  func_obj.tag = method.tag;
  func_obj.u.float64 = method.u.float64;
  local_48 = JVar7;
  JVar8 = JS_CallFree(ctx,func_obj,pJVar4->handler,3,(JSValue *)&local_68);
  JS_FreeValue(ctx,JVar6);
  JS_FreeValue(ctx,JVar7);
  if ((int)JVar8.tag == 6) {
    return -1;
  }
  iVar1 = JS_ToBoolFree(ctx,JVar8);
  if (iVar1 == 0) {
    if (((uint)flags >> 0xe & 1) == 0) {
      return 0;
    }
    fmt = "proxy: defineProperty exception";
    goto LAB_0013a7e7;
  }
  p_00 = (JSObject *)(pJVar4->target).u.ptr;
  iVar2 = JS_GetOwnPropertyInternal(ctx,&desc,p_00,prop);
  iVar1 = desc.flags;
  if (iVar2 < 0) {
    return -1;
  }
  if (iVar2 == 0) {
    if (((flags & 0x101U) != 0x100) && (((p_00->field_0).header.dummy1 & 1) != 0)) {
      return 1;
    }
  }
  else {
    BVar3 = check_define_prop_flags(desc.flags,flags);
    if ((BVar3 != 0) && (((flags & 0x101U) == 0x100 & (byte)iVar1) == 0)) {
      if ((flags & 0x1800U) == 0) {
        if (((uint)flags >> 0xd & 1) != 0) {
          if ((flags & 2U) == 0 && (iVar1 & 3U) == 2) goto LAB_0013a7bc;
          setter.tag = val.tag;
          setter.u = JVar5;
          if ((iVar1 & 3U) == 0) goto LAB_0013a8b6;
        }
      }
      else if ((iVar1 & 0x11U) == 0x10) {
        if (((uint)flags >> 0xb & 1) != 0) {
          BVar3 = js_same_value(ctx,getter,desc.getter);
          if (BVar3 == 0) goto LAB_0013a7bc;
        }
        desc.value.u = desc.setter.u;
        desc.value.tag = desc.setter.tag;
        if (((uint)flags >> 0xc & 1) != 0) {
LAB_0013a8b6:
          JVar6.tag = setter.tag;
          JVar6.u.ptr = setter.u.ptr;
          JVar7.tag = desc.value.tag;
          JVar7.u.float64 = desc.value.u.float64;
          BVar3 = js_same_value(ctx,JVar6,JVar7);
          if (BVar3 == 0) goto LAB_0013a7bc;
        }
      }
      if ((((uint)flags >> 9 & 1) == 0) || ((desc.flags & 0x13U) != 2)) {
        js_free_desc(ctx,&desc);
        return 1;
      }
    }
LAB_0013a7bc:
    js_free_desc(ctx,&desc);
  }
  fmt = "proxy: inconsistent defineProperty";
LAB_0013a7e7:
  JS_ThrowTypeError(ctx,fmt);
  return -1;
}

Assistant:

static int js_proxy_define_own_property(JSContext *ctx, JSValueConst obj,
                                        JSAtom prop, JSValueConst val,
                                        JSValueConst getter, JSValueConst setter,
                                        int flags)
{
    JSProxyData *s;
    JSValue method, ret1, prop_val, desc_val;
    int res, ret;
    JSObject *p;
    JSValueConst args[3];
    JSPropertyDescriptor desc;
    BOOL setting_not_configurable;

    s = get_proxy_method(ctx, &method, obj, JS_ATOM_defineProperty);
    if (!s)
        return -1;
    if (JS_IsUndefined(method)) {
        return JS_DefineProperty(ctx, s->target, prop, val, getter, setter, flags);
    }
    prop_val = JS_AtomToValue(ctx, prop);
    if (JS_IsException(prop_val)) {
        JS_FreeValue(ctx, method);
        return -1;
    }
    desc_val = js_create_desc(ctx, val, getter, setter, flags);
    if (JS_IsException(desc_val)) {
        JS_FreeValue(ctx, prop_val);
        JS_FreeValue(ctx, method);
        return -1;
    }
    args[0] = s->target;
    args[1] = prop_val;
    args[2] = desc_val;
    ret1 = JS_CallFree(ctx, method, s->handler, 3, args);
    JS_FreeValue(ctx, prop_val);
    JS_FreeValue(ctx, desc_val);
    if (JS_IsException(ret1))
        return -1;
    ret = JS_ToBoolFree(ctx, ret1);
    if (!ret) {
        if (flags & JS_PROP_THROW) {
            JS_ThrowTypeError(ctx, "proxy: defineProperty exception");
            return -1;
        } else {
            return 0;
        }
    }
    p = JS_VALUE_GET_OBJ(s->target);
    res = JS_GetOwnPropertyInternal(ctx, &desc, p, prop);
    if (res < 0)
        return -1;
    setting_not_configurable = ((flags & (JS_PROP_HAS_CONFIGURABLE |
                                          JS_PROP_CONFIGURABLE)) ==
                                JS_PROP_HAS_CONFIGURABLE);
    if (!res) {
        if (!p->extensible || setting_not_configurable)
            goto fail;
    } else {
        if (!check_define_prop_flags(desc.flags, flags) ||
            ((desc.flags & JS_PROP_CONFIGURABLE) && setting_not_configurable)) {
            goto fail1;
        }
        if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
            if ((desc.flags & (JS_PROP_GETSET | JS_PROP_CONFIGURABLE)) ==
                JS_PROP_GETSET) {
                if ((flags & JS_PROP_HAS_GET) &&
                    !js_same_value(ctx, getter, desc.getter)) {
                    goto fail1;
                }
                if ((flags & JS_PROP_HAS_SET) &&
                    !js_same_value(ctx, setter, desc.setter)) {
                    goto fail1;
                }
            }
        } else if (flags & JS_PROP_HAS_VALUE) {
            if ((desc.flags & (JS_PROP_CONFIGURABLE | JS_PROP_WRITABLE)) ==
                JS_PROP_WRITABLE && !(flags & JS_PROP_WRITABLE)) {
                /* missing-proxy-check feature */
                goto fail1;
            } else if ((desc.flags & (JS_PROP_CONFIGURABLE | JS_PROP_WRITABLE)) == 0 &&
                !js_same_value(ctx, val, desc.value)) {
                goto fail1;
            }
        }
        if (flags & JS_PROP_HAS_WRITABLE) {
            if ((desc.flags & (JS_PROP_GETSET | JS_PROP_CONFIGURABLE |
                               JS_PROP_WRITABLE)) == JS_PROP_WRITABLE) {
                /* proxy-missing-checks */
            fail1:
                js_free_desc(ctx, &desc);
            fail:
                JS_ThrowTypeError(ctx, "proxy: inconsistent defineProperty");
                return -1;
            }
        }
        js_free_desc(ctx, &desc);
    }
    return 1;
}